

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void __thiscall
phosg::RedBoldTerminalGuard::RedBoldTerminalGuard
          (RedBoldTerminalGuard *this,function<void_(const_void_*,_unsigned_long)> *write_data,
          bool active)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  undefined7 in_register_00000011;
  string e;
  unsigned_long local_48;
  pointer local_40;
  string local_38;
  
  ::std::function<void_(const_void_*,_unsigned_long)>::function(&this->write_data,write_data);
  this->active = active;
  if ((int)CONCAT71(in_register_00000011,active) != 0) {
    format_color_escape_abi_cxx11_(&local_38,BOLD,0x1f,0xffffffff);
    local_40 = local_38._M_dataplus._M_p;
    local_48 = local_38._M_string_length;
    if ((this->write_data).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = ::std::__throw_bad_function_call();
      p_Var1 = (this->write_data).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
      }
      _Unwind_Resume(uVar2);
    }
    (*(this->write_data)._M_invoker)((_Any_data *)this,&local_40,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

RedBoldTerminalGuard(function<void(const void*, size_t)> write_data, bool active = true)
      : write_data(write_data),
        active(active) {
    if (this->active) {
      string e = format_color_escape(
          TerminalFormat::BOLD, TerminalFormat::FG_RED, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }